

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
* __thiscall
pbrt::
Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
::operator=(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            *this,Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  *other)

{
  int iVar1;
  void *pvVar2;
  memory_resource *pmVar3;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_> *pvVar4
  ;
  ulong uVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  int iVar9;
  undefined4 extraout_var;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Bounds2<int> tmp;
  
  if ((this->allocator).memoryResource == (other->allocator).memoryResource) {
    TVar6 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar7 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar8 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar8;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar6;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar7;
    pvVar4 = this->values;
    this->values = other->values;
    other->values = pvVar4;
  }
  else {
    iVar9 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if ((((other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x == iVar9) &&
        ((other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y == iVar1)) &&
       (auVar12._8_8_ = 0, auVar12._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>,
       auVar14._8_8_ = 0, auVar14._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>,
       uVar5 = vpcmpd_avx512vl(auVar12,auVar14,4), (uVar5 & 3) == 0)) {
      uVar10 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1) *
               ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar9);
      if (0 < (int)uVar10) {
        lVar11 = 0;
        do {
          pvVar2 = *(void **)((long)&(this->values->
                                     super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar11);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,*(long *)((long)&(this->values->
                                                                                                        
                                                  super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                                  )._M_impl.super__Vector_impl_data.
                                                  _M_end_of_storage + lVar11) - (long)pvVar2);
          }
          std::
          vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
          ::vector((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)((long)&(this->values->
                              super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11),
                   (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)((long)&(other->values->
                              super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11));
          lVar11 = lVar11 + 0x18;
        } while ((ulong)uVar10 * 0x18 != lVar11);
      }
      TVar6 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
    }
    else {
      uVar10 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1) *
               ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar9);
      if (0 < (int)uVar10) {
        lVar11 = 0;
        do {
          pvVar2 = *(void **)((long)&(this->values->
                                     super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar11);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,*(long *)((long)&(this->values->
                                                                                                        
                                                  super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                                  )._M_impl.super__Vector_impl_data.
                                                  _M_end_of_storage + lVar11) - (long)pvVar2);
          }
          lVar11 = lVar11 + 0x18;
        } while ((ulong)uVar10 * 0x18 != lVar11);
      }
      pmVar3 = (this->allocator).memoryResource;
      (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->values,(long)(int)uVar10 * 0x18,8);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      auVar14 = vpsubd_avx(auVar13,auVar15);
      auVar12 = vpshufd_avx(auVar14,0x55);
      auVar12 = vpmulld_avx(auVar12,auVar14);
      uVar10 = auVar12._0_4_;
      pmVar3 = (this->allocator).memoryResource;
      iVar9 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,(long)(int)uVar10 * 0x18,8);
      this->values = (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                      *)CONCAT44(extraout_var,iVar9);
      if (0 < (int)uVar10) {
        lVar11 = 0;
        do {
          std::
          vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
          ::vector((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)((long)&(this->values->
                              super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11),
                   (vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                    *)((long)&(other->values->
                              super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11));
          lVar11 = lVar11 + 0x18;
        } while ((ulong)uVar10 * 0x18 != lVar11);
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }